

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinRoberts_fp.c
# Opt level: O3

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  int iVar3;
  N_Vector u;
  long lVar4;
  void *kmem;
  char *pcVar5;
  sunrealtype rtol;
  sunrealtype atol;
  SUNContext sunctx;
  sunrealtype fnorm;
  undefined8 local_38;
  undefined8 local_30;
  void *local_28;
  
  local_30 = 0;
  puts("Example problem from chemical kinetics solving");
  puts("the first time step in a Backward Euler solution for the");
  puts("following three rate equations:");
  puts("    dy1/dt = -.04*y1 + 1.e4*y2*y3");
  puts("    dy2/dt = .04*y1 - 1.e4*y2*y3 - 3.e2*(y2)^2");
  puts("    dy3/dt = 3.e2*(y2)^2");
  puts("on the interval from t = 0.0 to t = 0.1, with initial");
  puts("conditions: y1 = 1.0, y2 = y3 = 0.");
  puts("Solution method: Anderson accelerated fixed point iteration.");
  uVar2 = SUNContext_Create(0,&local_38);
  if ((int)uVar2 < 0) {
    pcVar5 = "SUNContext_Create";
  }
  else {
    u = (N_Vector)N_VNew_Serial(3,local_38);
    if (u == (N_Vector)0x0) {
      main_cold_3();
      return 1;
    }
    lVar4 = N_VNew_Serial(3,local_38);
    if (lVar4 == 0) {
      main_cold_2();
      return 1;
    }
    kmem = (void *)KINCreate(local_38);
    local_28 = kmem;
    if (kmem == (void *)0x0) {
      main_cold_1();
      return 1;
    }
    KINSetMAA(kmem,2);
    uVar2 = KINInit(kmem,funcRoberts,u);
    if ((int)uVar2 < 0) {
      pcVar5 = "KINInit";
    }
    else {
      uVar2 = KINSetFuncNormTol(0x3ddb7cdfd9d7bdbb,kmem);
      if ((int)uVar2 < 0) {
        pcVar5 = "KINSetFuncNormTol";
      }
      else {
        N_VConst(0,u);
        **(undefined8 **)((long)u->content + 0x10) = 0x3ff0000000000000;
        N_VConst(0x3ff0000000000000,lVar4);
        uVar2 = KINSol(kmem,u,3,lVar4,lVar4);
        if ((int)uVar2 < 0) {
          pcVar5 = "KINSol";
        }
        else {
          uVar2 = KINGetFuncNorm(kmem,&local_30);
          if (-1 < (int)uVar2) {
            printf("\nComputed solution (||F|| = %g):\n\n",local_30);
            puVar1 = *(undefined8 **)((long)u->content + 0x10);
            atol = (sunrealtype)puVar1[1];
            printf("y =%14.6e  %14.6e  %14.6e\n",*puVar1,atol,puVar1[2]);
            PrintFinalStats(kmem);
            iVar3 = check_ans(u,rtol,atol);
            N_VDestroy(u);
            N_VDestroy(lVar4);
            KINFree(&local_28);
            SUNContext_Free(&local_38);
            return iVar3;
          }
          pcVar5 = "KINGetfuncNorm";
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar5,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype fnormtol, fnorm;
  N_Vector y, scale;
  int retval;
  void* kmem;

  fnorm = 0.0;
  y = scale = NULL;
  kmem      = NULL;

  /* -------------------------
   * Print problem description
   * ------------------------- */

  printf("Example problem from chemical kinetics solving\n");
  printf("the first time step in a Backward Euler solution for the\n");
  printf("following three rate equations:\n");
  printf("    dy1/dt = -.04*y1 + 1.e4*y2*y3\n");
  printf("    dy2/dt = .04*y1 - 1.e4*y2*y3 - 3.e2*(y2)^2\n");
  printf("    dy3/dt = 3.e2*(y2)^2\n");
  printf("on the interval from t = 0.0 to t = 0.1, with initial\n");
  printf("conditions: y1 = 1.0, y2 = y3 = 0.\n");
  printf("Solution method: Anderson accelerated fixed point iteration.\n");

  /* Create the SUNDIALS context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* --------------------------------------
   * Create vectors for solution and scales
   * -------------------------------------- */

  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  scale = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)scale, "N_VNew_Serial", 0)) { return (1); }

  /* -----------------------------------------
   * Initialize and allocate memory for KINSOL
   * ----------------------------------------- */

  kmem = KINCreate(sunctx);
  if (check_retval((void*)kmem, "KINCreate", 0)) { return (1); }

  /* y is used as a template */

  /* Set number of prior residuals used in Anderson acceleration */
  retval = KINSetMAA(kmem, PRIORS);

  retval = KINInit(kmem, funcRoberts, y);
  if (check_retval(&retval, "KINInit", 1)) { return (1); }

  /* -------------------
   * Set optional inputs
   * ------------------- */

  /* Specify stopping tolerance based on residual */

  fnormtol = TOL;
  retval   = KINSetFuncNormTol(kmem, fnormtol);
  if (check_retval(&retval, "KINSetFuncNormTol", 1)) { return (1); }

  /* -------------
   * Initial guess
   * ------------- */

  N_VConst(ZERO, y);
  Ith(y, 1) = ONE;

  /* ----------------------------
   * Call KINSol to solve problem
   * ---------------------------- */

  /* No scaling used */
  N_VConst(ONE, scale);

  /* Call main solver */
  retval = KINSol(kmem,   /* KINSol memory block */
                  y,      /* initial guess on input; solution vector */
                  KIN_FP, /* global strategy choice */
                  scale,  /* scaling vector, for the variable cc */
                  scale); /* scaling vector for function values fval */
  if (check_retval(&retval, "KINSol", 1)) { return (1); }

  /* ------------------------------------
   * Print solution and solver statistics
   * ------------------------------------ */

  /* Get scaled norm of the system function */

  retval = KINGetFuncNorm(kmem, &fnorm);
  if (check_retval(&retval, "KINGetfuncNorm", 1)) { return (1); }

#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("\nComputed solution (||F|| = %Lg):\n\n", fnorm);
#else
  printf("\nComputed solution (||F|| = %g):\n\n", fnorm);
#endif
  PrintOutput(y);

  PrintFinalStats(kmem);

  /* check the solution error */
  retval = check_ans(y, SUN_RCONST(1e-4), SUN_RCONST(1e-6));

  /* -----------
   * Free memory
   * ----------- */

  N_VDestroy(y);
  N_VDestroy(scale);
  KINFree(&kmem);
  SUNContext_Free(&sunctx);

  return (retval);
}